

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printStatistics(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,ostream *os)

{
  long lVar1;
  char *pcVar2;
  
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 4;
  printStatus(this,os,this->_status);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Original problem    : \n",0x17);
  if (this->_currentSettings->_intParamValues[0x10] == 0) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::printProblemStatistics(this->_realLP,os);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::printProblemStatistics(this->_rationalLP,os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"Objective sense     : ",0x16);
  pcVar2 = "maximize\n";
  if (this->_currentSettings->_intParamValues[0] == -1) {
    pcVar2 = "minimize\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,9);
  printSolutionStatistics(this,os);
  Statistics::print(this->_statistics,os);
  return;
}

Assistant:

void SoPlexBase<R>::printStatistics(std::ostream& os)
{
   SPxOut::setFixed(os, 2);

   printStatus(os, _status);

   os << "Original problem    : \n";

   if(intParam(SoPlexBase<R>::READMODE) == READMODE_REAL)
      _realLP->printProblemStatistics(os);
   else
      _rationalLP->printProblemStatistics(os);

   os << "Objective sense     : " << (intParam(SoPlexBase<R>::OBJSENSE) ==
                                      SoPlexBase<R>::OBJSENSE_MINIMIZE ? "minimize\n" : "maximize\n");
   printSolutionStatistics(os);
   printSolvingStatistics(os);
}